

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O2

void __thiscall QTextTablePrivate::update(QTextTablePrivate *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  value_type vVar1;
  QTextDocumentPrivate *pQVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  reference pvVar7;
  pointer piVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  ulong local_78;
  value_type_conflict4 local_4c;
  QSharedDataPointer<QTextFormatPrivate> local_48;
  QTextFormat *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QTextTable::format((QTextTable *)&stack0xffffffffffffffb8);
  iVar5 = QTextTableFormat::columns((QTextTableFormat *)&stack0xffffffffffffffb8);
  this->nCols = iVar5;
  QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
  lVar10 = (long)this->nCols;
  iVar5 = (int)(((this->cells).d.size + lVar10 + -1) / lVar10);
  this->nRows = iVar5;
  this_00 = &this->grid;
  local_48.d.ptr =
       (totally_ordered_wrapper<QTextFormatPrivate_*>)((ulong)local_48.d.ptr._4_4_ << 0x20);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (this_00,iVar5 * lVar10,(value_type_conflict4 *)&stack0xffffffffffffffb8);
  pQVar2 = (this->super_QTextFramePrivate).super_QTextObjectPrivate.pieceTable;
  QList<int>::resize(&this->cellIndices,(this->cells).d.size);
  uVar13 = 0;
  local_78 = 0;
  do {
    if ((ulong)(this->cells).d.size <= uVar13) {
      this->dirty = false;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    vVar1 = (this->cells).d.ptr[uVar13];
    local_48.d.ptr = (totally_ordered_wrapper<QTextFormatPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QTextFormat *)&DAT_aaaaaaaaaaaaaaaa;
    QTextFormatCollection::charFormat
              ((QTextFormatCollection *)&stack0xffffffffffffffb8,(int)pQVar2 + 0xe8);
    iVar5 = QTextCharFormat::tableCellRowSpan((QTextCharFormat *)&stack0xffffffffffffffb8);
    iVar6 = QTextCharFormat::tableCellColumnSpan((QTextCharFormat *)&stack0xffffffffffffffb8);
    for (local_78 = (ulong)(int)local_78; iVar9 = this->nCols,
        (long)local_78 < (long)this->nRows * (long)iVar9; local_78 = local_78 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_00,local_78);
      if (*pvVar7 == 0) {
        iVar9 = this->nCols;
        break;
      }
    }
    uVar3 = (ulong)(uint)((int)local_78 >> 0x1f) << 0x20 | local_78 & 0xffffffff;
    uVar4 = (long)uVar3 / (long)iVar9;
    uVar15 = uVar4 & 0xffffffff;
    piVar8 = QList<int>::data(&this->cellIndices);
    piVar8[uVar13] = (int)local_78;
    iVar11 = (int)uVar4 + iVar5;
    if (this->nRows < iVar11) {
      local_4c = 0;
      std::vector<int,_std::allocator<int>_>::resize
                (this_00,(long)iVar11 * (long)this->nCols,&local_4c);
      this->nRows = iVar11;
    }
    iVar11 = 0;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (iVar5 < 1) {
      iVar5 = iVar11;
    }
    for (; iVar12 = (int)((long)uVar3 % (long)iVar9), iVar14 = iVar6, iVar11 != iVar5;
        iVar11 = iVar11 + 1) {
      while( true ) {
        bVar16 = iVar14 == 0;
        iVar14 = iVar14 + -1;
        if (bVar16) break;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (this_00,(long)(this->nCols * (int)uVar15 + iVar12));
        *pvVar7 = vVar1;
        iVar12 = iVar12 + 1;
      }
      uVar15 = (ulong)((int)uVar15 + 1);
    }
    QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void QTextTablePrivate::update() const
{
    Q_Q(const QTextTable);
    nCols = q->format().columns();
    nRows = (cells.size() + nCols-1)/nCols;
//     qDebug(">>>> QTextTablePrivate::update, nRows=%d, nCols=%d", nRows, nCols);

    grid.assign(nRows * nCols, 0);

    QTextDocumentPrivate *p = pieceTable;
    QTextFormatCollection *c = p->formatCollection();

    cellIndices.resize(cells.size());

    int cell = 0;
    for (int i = 0; i < cells.size(); ++i) {
        int fragment = cells.at(i);
        QTextCharFormat fmt = c->charFormat(QTextDocumentPrivate::FragmentIterator(&p->fragmentMap(), fragment)->format);
        int rowspan = fmt.tableCellRowSpan();
        int colspan = fmt.tableCellColumnSpan();

        // skip taken cells
        while (cell < nRows*nCols && grid[cell])
            ++cell;

        int r = cell/nCols;
        int c = cell%nCols;
        cellIndices[i] = cell;

        if (r + rowspan > nRows) {
            grid.resize((r + rowspan) * nCols, 0);
            nRows = r + rowspan;
        }

        Q_ASSERT(c + colspan <= nCols);
        for (int ii = 0; ii < rowspan; ++ii) {
            for (int jj = 0; jj < colspan; ++jj) {
                Q_ASSERT(grid[(r+ii)*nCols + c+jj] == 0);
                grid[(r+ii)*nCols + c+jj] = fragment;
//              qDebug("    setting cell %d span=%d/%d at %d/%d", fragment, rowspan, colspan, r+ii, c+jj);
            }
        }
    }
//     qDebug("<<<< end: nRows=%d, nCols=%d", nRows, nCols);

    dirty = false;
}